

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-ioutil.cc
# Opt level: O2

void ioutil_test(void)

{
  bool bVar1;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_48,"./",&local_69);
  std::__cxx11::string::string((string *)&local_68,"./dora",&local_6a);
  tinyusdz::io::JoinPath(&local_28,&local_48,&local_68);
  bVar1 = std::operator==(&local_28,"./dora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-ioutil.cc"
                 ,0xf,"%s","io::JoinPath(\"./\", \"./dora\") == \"./dora\"");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ioutil_test(void) {
  {
    TEST_CHECK(io::JoinPath("./", "./dora") == "./dora");
  }
}